

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

sexp_conflict
sexp_condition_variable_signal
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict condvar)

{
  sexp_mark_stack_ptr_t *psVar1;
  sexp_mark_stack_ptr_t **ppsVar2;
  sexp_conflict **pppsVar3;
  sexp_mark_stack_ptr_t *psVar4;
  
  pppsVar3 = &(((ctx->value).type.setters)->value).context.mark_stack[10].end;
  psVar4 = (sexp_mark_stack_ptr_t *)0x23e;
  ppsVar2 = (sexp_mark_stack_ptr_t **)pppsVar3;
  while( true ) {
    psVar1 = *ppsVar2;
    if (((ulong)psVar1 & 3) != 0) {
      return (sexp_conflict)&DAT_0000003e;
    }
    if (*(int *)&psVar1->start != 6) break;
    if (psVar1->end[0xb] == condvar) {
      ppsVar2 = &psVar4->prev;
      if (psVar4 == (sexp_mark_stack_ptr_t *)0x23e) {
        ppsVar2 = (sexp_mark_stack_ptr_t **)pppsVar3;
      }
      *ppsVar2 = psVar1->prev;
      psVar1->prev = (((ctx->value).type.setters)->value).context.mark_stack[9].prev;
      (((ctx->value).type.setters)->value).context.mark_stack[9].prev = psVar1;
      if ((((ulong)psVar1->prev & 3) != 0) || (*(int *)&psVar1->prev->start != 6)) {
        (((ctx->value).type.setters)->value).context.mark_stack[10].start = (sexp_conflict *)psVar1;
      }
      *(undefined1 *)((long)psVar1->end + 0x60aa) = 0;
      *(undefined1 *)((long)psVar1->end + 0x60ab) = 0;
      return (sexp_conflict)0x13e;
    }
    ppsVar2 = &psVar1->prev;
    psVar4 = psVar1;
  }
  return (sexp_conflict)&DAT_0000003e;
}

Assistant:

sexp sexp_condition_variable_signal (sexp ctx, sexp self, sexp_sint_t n, sexp condvar) {
  sexp ls1=SEXP_NULL, ls2=sexp_global(ctx, SEXP_G_THREADS_PAUSED);
  for ( ; sexp_pairp(ls2); ls1=ls2, ls2=sexp_cdr(ls2))
    if (sexp_context_event(sexp_car(ls2)) == condvar) {
      if (ls1==SEXP_NULL)
        sexp_global(ctx, SEXP_G_THREADS_PAUSED) = sexp_cdr(ls2);
      else
        sexp_cdr(ls1) = sexp_cdr(ls2);
      sexp_cdr(ls2) = sexp_global(ctx, SEXP_G_THREADS_FRONT);
      sexp_global(ctx, SEXP_G_THREADS_FRONT) = ls2;
      if (! sexp_pairp(sexp_cdr(ls2)))
        sexp_global(ctx, SEXP_G_THREADS_BACK) = ls2;
      sexp_context_waitp(sexp_car(ls2)) = sexp_context_timeoutp(sexp_car(ls2)) = 0;
      return SEXP_TRUE;
    }
  return SEXP_FALSE;
}